

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O1

void bloaty::macho::ParseMachOHeader<bloaty::macho::AddMachOFallback(bloaty::RangeSink*)::__0>
               (string_view macho_file,RangeSink *overhead_sink,
               anon_class_8_1_89918b91 *loadcmd_func)

{
  char *pcVar1;
  uint64_t end;
  int *piVar2;
  ulong uVar3;
  RangeSink *in_R8;
  int iVar4;
  char *pcVar5;
  string_view command_data;
  string_view command_data_00;
  string_view command_data_01;
  string_view command_data_02;
  string_view data;
  string_view data_00;
  string_view data_01;
  string_view data_02;
  
  piVar2 = (int *)macho_file._M_str;
  uVar3 = macho_file._M_len;
  if (uVar3 < 4) {
    Throw("Malformed Mach-O file",0x2c);
  }
  iVar4 = *piVar2;
  if (iVar4 < -0x1120531) {
    if (iVar4 != -0x1120532) {
      if ((iVar4 == -0x31051202) || (iVar4 == -0x30051202)) {
        Throw("We don\'t support cross-endian Mach-O files.",0x97);
      }
LAB_00197293:
      Throw("Corrupt Mach-O file",0x99);
    }
    if (uVar3 < 0x1c) {
LAB_00197218:
      Throw("Premature EOF reading Mach-O data.",0x36);
    }
    data._M_str = (char *)in_R8;
    data._M_len = (size_t)piVar2;
    MaybeAddOverhead((macho *)overhead_sink,(RangeSink *)"[Mach-O Headers]",(char *)0x1c,data);
    iVar4 = piVar2[4];
    if (iVar4 != 0) {
      piVar2 = piVar2 + 7;
      pcVar5 = (char *)(uVar3 - 0x1c);
      do {
        if (pcVar5 < (char *)0x8) goto LAB_00197218;
        pcVar1 = (char *)(ulong)(uint)piVar2[1];
        if (pcVar1 == (char *)0x0) {
LAB_00197229:
          Throw("Mach-O load command had zero size.",0x66);
        }
        if (pcVar5 < pcVar1) {
LAB_0019723a:
          Throw("region out-of-bounds",0x5d);
        }
        if (*piVar2 == 1) {
          in_R8 = loadcmd_func->sink;
          command_data_00._M_str = (char *)piVar2;
          command_data_00._M_len = (size_t)pcVar1;
          AddSegmentAsFallback<segment_command,section>(command_data_00,macho_file,in_R8);
        }
        else if (*piVar2 == 0x19) {
          in_R8 = loadcmd_func->sink;
          command_data._M_str = (char *)piVar2;
          command_data._M_len = (size_t)pcVar1;
          AddSegmentAsFallback<segment_command_64,section_64>(command_data,macho_file,in_R8);
        }
        data_00._M_str = (char *)in_R8;
        data_00._M_len = (size_t)piVar2;
        MaybeAddOverhead((macho *)overhead_sink,(RangeSink *)"[Mach-O Headers]",pcVar1,data_00);
        pcVar1 = (char *)(ulong)(uint)piVar2[1];
        if (pcVar5 < pcVar1) {
LAB_0019724b:
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     pcVar1,pcVar5);
        }
        piVar2 = (int *)((long)piVar2 + (long)pcVar1);
        iVar4 = iVar4 + -1;
        pcVar5 = pcVar5 + -(long)pcVar1;
      } while (iVar4 != 0);
    }
  }
  else {
    if (iVar4 != -0x1120531) goto LAB_00197293;
    if (uVar3 < 0x20) goto LAB_00197218;
    data_01._M_str = (char *)in_R8;
    data_01._M_len = (size_t)piVar2;
    MaybeAddOverhead((macho *)overhead_sink,(RangeSink *)"[Mach-O Headers]",(char *)0x20,data_01);
    iVar4 = piVar2[4];
    if (iVar4 != 0) {
      piVar2 = piVar2 + 8;
      pcVar5 = (char *)(uVar3 - 0x20);
      do {
        if (pcVar5 < (char *)0x8) goto LAB_00197218;
        pcVar1 = (char *)(ulong)(uint)piVar2[1];
        if (pcVar1 == (char *)0x0) goto LAB_00197229;
        if (pcVar5 < pcVar1) goto LAB_0019723a;
        if (*piVar2 == 1) {
          in_R8 = loadcmd_func->sink;
          command_data_02._M_str = (char *)piVar2;
          command_data_02._M_len = (size_t)pcVar1;
          AddSegmentAsFallback<segment_command,section>(command_data_02,macho_file,in_R8);
        }
        else if (*piVar2 == 0x19) {
          in_R8 = loadcmd_func->sink;
          command_data_01._M_str = (char *)piVar2;
          command_data_01._M_len = (size_t)pcVar1;
          AddSegmentAsFallback<segment_command_64,section_64>(command_data_01,macho_file,in_R8);
        }
        data_02._M_str = (char *)in_R8;
        data_02._M_len = (size_t)piVar2;
        MaybeAddOverhead((macho *)overhead_sink,(RangeSink *)"[Mach-O Headers]",pcVar1,data_02);
        pcVar1 = (char *)(ulong)(uint)piVar2[1];
        if (pcVar5 < pcVar1) goto LAB_0019724b;
        piVar2 = (int *)((long)piVar2 + (long)pcVar1);
        iVar4 = iVar4 + -1;
        pcVar5 = pcVar5 + -(long)pcVar1;
      } while (iVar4 != 0);
    }
  }
  return;
}

Assistant:

void ParseMachOHeader(string_view macho_file, RangeSink* overhead_sink,
                      Func&& loadcmd_func) {
  uint32_t magic = ReadMagic(macho_file);
  switch (magic) {
    case MH_MAGIC:
      // We don't expect to see many 32-bit binaries out in the wild.
      // Apple is aggressively phasing out support for 32-bit binaries:
      //   https://www.macrumors.com/2017/06/06/apple-to-phase-out-32-bit-mac-apps/
      //
      // Still, you can build 32-bit binaries as of this writing, and
      // there are existing 32-bit binaries floating around, so we might
      // as well support them.
      ParseMachOHeaderImpl<mach_header>(macho_file, overhead_sink,
                                        std::forward<Func>(loadcmd_func));
      break;
    case MH_MAGIC_64:
      ParseMachOHeaderImpl<mach_header_64>(
          macho_file, overhead_sink, std::forward<Func>(loadcmd_func));
      break;
    case MH_CIGAM:
    case MH_CIGAM_64:
      // OS X and Darwin currently only run on x86/x86-64 (little-endian
      // platforms), so we expect basically all Mach-O files to be
      // little-endian.  Additionally, pretty much all CPU architectures
      // are little-endian these days.  ARM has the option to be
      // big-endian, but I can't find any OS that is actually compiled to
      // use big-endian mode.  debian-mips is the only big-endian OS I can
      // find (and maybe SPARC).
      //
      // All of this is to say, this case should only happen if you are
      // running Bloaty on debian-mips.  I consider that uncommon enough
      // (and hard enough to test) that we don't support this until there
      // is a demonstrated need.
      THROW("We don't support cross-endian Mach-O files.");
    default:
      THROW("Corrupt Mach-O file");
  }
}